

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::python::Generator::PrintFieldDescriptorsInDescriptor
          (Generator *this,Descriptor *message_descriptor,bool is_extension,
          string *list_variable_name,offset_in_Descriptor_to_subr CountFn,
          offset_in_Descriptor_to_subr GetterFn)

{
  int iVar1;
  code *pcVar2;
  FieldDescriptor *field;
  int i;
  int iVar3;
  code *in_stack_00000008;
  long in_stack_00000010;
  
  io::Printer::Print(this->printer_,"$list$=[\n","list",list_variable_name);
  io::Printer::Indent(this->printer_);
  iVar3 = 0;
  while( true ) {
    pcVar2 = (code *)CountFn;
    if ((CountFn & 1) != 0) {
      pcVar2 = *(code **)(*(long *)(message_descriptor + GetterFn) + -1 + CountFn);
    }
    iVar1 = (*pcVar2)(message_descriptor + GetterFn);
    if (iVar1 <= iVar3) break;
    pcVar2 = in_stack_00000008;
    if (((ulong)in_stack_00000008 & 1) != 0) {
      pcVar2 = *(code **)(in_stack_00000008 + *(long *)(message_descriptor + in_stack_00000010) + -1
                         );
    }
    field = (FieldDescriptor *)(*pcVar2)(message_descriptor + in_stack_00000010,iVar3);
    PrintFieldDescriptor(this,field,is_extension);
    io::Printer::Print(this->printer_,",\n");
    iVar3 = iVar3 + 1;
  }
  io::Printer::Outdent(this->printer_);
  io::Printer::Print(this->printer_,"],\n");
  return;
}

Assistant:

void Generator::PrintFieldDescriptorsInDescriptor(
    const Descriptor& message_descriptor,
    bool is_extension,
    const string& list_variable_name,
    int (Descriptor::*CountFn)() const,
    const FieldDescriptor* (Descriptor::*GetterFn)(int) const) const {
  printer_->Print("$list$=[\n", "list", list_variable_name);
  printer_->Indent();
  for (int i = 0; i < (message_descriptor.*CountFn)(); ++i) {
    PrintFieldDescriptor(*(message_descriptor.*GetterFn)(i),
                         is_extension);
    printer_->Print(",\n");
  }
  printer_->Outdent();
  printer_->Print("],\n");
}